

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsum.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  void *pvVar2;
  long *plVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  
  if (argc == 1) {
    main_cold_1();
    iVar4 = 1;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    if (0 < argc) {
      uVar5 = (long)(int)(argc - 1U) * 8;
    }
    pvVar2 = operator_new__(uVar5);
    NaOpenLogFile("dsum.log");
    uVar5 = (ulong)(argc - 1U);
    if (1 < argc) {
      uVar8 = 0;
      do {
        plVar3 = (long *)OpenInputDataFile(argv[uVar8 + 1]);
        *(long **)((long)pvVar2 + uVar8 * 8) = plVar3;
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x28))(plVar3);
        }
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    bVar6 = false;
    bVar7 = false;
    do {
      if (1 < argc) {
        uVar8 = 0;
        do {
          plVar3 = *(long **)((long)pvVar2 + uVar8 * 8);
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 0x18))(plVar3,0);
            cVar1 = (**(code **)(**(long **)((long)pvVar2 + uVar8 * 8) + 0x20))();
            bVar7 = bVar6;
            if (cVar1 == '\0') {
              bVar6 = true;
              bVar7 = true;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      printf("%g\n");
    } while (!bVar7);
    if (1 < argc) {
      uVar8 = 0;
      do {
        plVar3 = *(long **)((long)pvVar2 + uVar8 * 8);
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 8))();
        }
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    operator_delete(pvVar2,8);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc == 1)
    {
      fprintf(stderr, "Error: need arguments\n");
      fprintf(stderr, "Usage: dsum SignalSeries1 [SignalSeries2 ...]\n");
      return 1;
    }

  int		i, n = argc - 1;
  NaDataFile	**dfSeries = new NaDataFile*[n];

  NaOpenLogFile("dsum.log");

  for(i = 0; i < n; ++i)
    {
      try{
	dfSeries[i] = OpenInputDataFile(argv[1+i]);
	if(NULL != dfSeries[i])
	  dfSeries[i]->GoStartRecord();
      }
      catch(NaException& ex){
	NaPrintLog("Failed to open '%s' due to %s\n",
		   argv[1+i], NaExceptionMsg(ex));
	dfSeries[i] = NULL;
      }
    }

  try{
    NaReal	fSum;
    bool	bEOF = false;
    do{
      fSum = 0.0;

      for(i = 0; i < n; ++i)
	if(NULL != dfSeries[i])
	  {
	    fSum += dfSeries[i]->GetValue();
	    if(!dfSeries[i]->GoNextRecord())
	      bEOF = true;
	  }

      printf("%g\n", fSum);

    }while(!bEOF);

    for(i = 0; i < n; ++i)
      delete dfSeries[i];

    delete dfSeries;
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}